

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O2

void __thiscall
NewFunctionProcessingVisitor::Visit
          (NewFunctionProcessingVisitor *this,NewArrayExpression *expression)

{
  pointer pcVar1;
  int iVar2;
  ArrayValue *this_00;
  PrimitiveArrayObject *this_01;
  PrimitiveSimpleObject *this_02;
  Type *this_03;
  Value *pVVar3;
  string local_50;
  
  this_00 = (ArrayValue *)operator_new(0x30);
  this_01 = (PrimitiveArrayObject *)operator_new(0x10);
  this_02 = (PrimitiveSimpleObject *)operator_new(0x18);
  this_03 = (Type *)operator_new(0x28);
  pcVar1 = (expression->type_name_->type_name_)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((string *)&local_50,pcVar1,
             pcVar1 + ((expression->type_name_->type_name_)._M_string_length - 2));
  Type::Type(this_03,&local_50);
  PrimitiveSimpleObject::PrimitiveSimpleObject(this_02,this_03);
  PrimitiveArrayObject::PrimitiveArrayObject(this_01,this_02);
  ArrayValue::ArrayValue(this_00,this_01);
  std::__cxx11::string::~string((string *)&local_50);
  pVVar3 = TemplateVisitor<Value_*>::Accept
                     (&this->super_TemplateVisitor<Value_*>,&expression->length_->super_Node);
  iVar2 = (*pVVar3->_vptr_Value[2])(pVVar3);
  ArrayValue::Resize(this_00,(long)iVar2);
  (this->super_TemplateVisitor<Value_*>).tos_value_ = (Value *)this_00;
  return;
}

Assistant:

void NewFunctionProcessingVisitor::Visit(NewArrayExpression* expression) {
  auto new_arr = new ArrayValue(new PrimitiveArrayObject(
      new PrimitiveSimpleObject(new Type(std::string(
          expression->type_name_->type_name_.begin(), expression->type_name_->type_name_.end() - 2)))));

  size_t size = Accept(expression->length_)->GetValue();
  new_arr->Resize(size);
  tos_value_ = new_arr;
}